

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlParserCtxtSetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlParserCtxtPyCtxtPtr local_58;
  PyTypeObject *local_50;
  PyObject *pyobj_arg;
  PyObject *pyobj_f;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPyCtxtPtr pyCtxt;
  xmlParserCtxtPtr ctxt;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlParserCtxtSetErrorHandler",&pyobj_f,&pyobj_arg,&local_50);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_f == (PyObject *)&_Py_NoneStruct) {
      local_58 = (xmlParserCtxtPyCtxtPtr)0x0;
    }
    else {
      local_58 = (xmlParserCtxtPyCtxtPtr)pyobj_f[1].ob_refcnt;
    }
    pyCtxt = local_58;
    if (local_58[0x1a].arg == (PyObject *)0x0) {
      pyobj_ctxt = (PyObject *)(*_xmlMalloc)(0x10);
      if (pyobj_ctxt == (PyObject *)0x0) {
        pPVar2 = libxml_intWrap(-1);
        return pPVar2;
      }
      memset(pyobj_ctxt,0,0x10);
      pyCtxt[0x1a].arg = pyobj_ctxt;
    }
    else {
      pyobj_ctxt = local_58[0x1a].arg;
    }
    _Py_XDECREF((PyObject *)pyobj_ctxt->ob_refcnt);
    _Py_XINCREF(pyobj_arg);
    pyobj_ctxt->ob_refcnt = (Py_ssize_t)pyobj_arg;
    _Py_XDECREF((PyObject *)pyobj_ctxt->ob_type);
    _Py_XINCREF((PyObject *)local_50);
    pyobj_ctxt->ob_type = local_50;
    if (pyobj_arg == (PyObject *)&_Py_NoneStruct) {
      xmlCtxtSetErrorHandler(pyCtxt,0);
    }
    else {
      xmlCtxtSetErrorHandler(pyCtxt,libxml_xmlParserCtxtErrorHandler,pyCtxt);
    }
    self_local = libxml_intWrap(1);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlParserCtxtSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) 
{
    PyObject *py_retval;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlParserCtxtSetErrorHandler",
		          &pyobj_ctxt, &pyobj_f, &pyobj_arg))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);
    if (ctxt->_private == NULL) {
	pyCtxt = xmlMalloc(sizeof(xmlParserCtxtPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	memset(pyCtxt,0,sizeof(xmlParserCtxtPyCtxt));
	ctxt->_private = pyCtxt;
    }
    else {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;
    }
    /* TODO: check f is a function ! */
    Py_XDECREF(pyCtxt->f);
    Py_XINCREF(pyobj_f);
    pyCtxt->f = pyobj_f;
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    if (pyobj_f != Py_None) {
        xmlCtxtSetErrorHandler(ctxt, libxml_xmlParserCtxtErrorHandler, ctxt);
    }
    else {
        xmlCtxtSetErrorHandler(ctxt, NULL, NULL);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}